

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transcode_utils.cpp
# Opt level: O0

TranscodeSwizzleInfo * ktx::determineTranscodeSwizzle(KTXTexture2 *texture,Reporter *report)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  bool bVar5;
  __optional_eq_t<_khr_df_model_channels_e,__khr_df_model_channels_e> _Var6;
  ktxTexture2 *args_1;
  _Optional_payload_base<_khr_df_model_channels_e> this;
  ktxTexture2 *__s;
  KTXTexture2 *in_RSI;
  TranscodeSwizzleInfo *in_RDI;
  optional<_khr_df_model_channels_e> sample1;
  optional<_khr_df_model_channels_e> sample0;
  ktx_uint32_t *bdfd;
  TranscodeSwizzleInfo *result;
  _khr_df_model_channels_e *in_stack_fffffffffffffea8;
  optional<_khr_df_model_channels_e> *in_stack_fffffffffffffeb0;
  KTXTexture2 *in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee1;
  undefined1 in_stack_fffffffffffffee2;
  undefined1 uVar7;
  undefined1 in_stack_fffffffffffffee3;
  undefined1 in_stack_fffffffffffffee4;
  undefined1 in_stack_fffffffffffffee5;
  undefined1 in_stack_fffffffffffffee6;
  undefined1 uVar8;
  undefined1 in_stack_fffffffffffffee7;
  undefined6 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1e;
  byte bVar9;
  allocator<char> in_stack_ffffffffffffff1f;
  undefined4 in_stack_ffffffffffffff20;
  ReturnCode in_stack_ffffffffffffff24;
  Reporter *in_stack_ffffffffffffff28;
  ReturnCode in_stack_ffffffffffffff34;
  Reporter *in_stack_ffffffffffffff38;
  bool local_aa;
  allocator<char> local_a9;
  string local_a8 [38];
  byte local_82;
  allocator<char> local_81;
  string local_80 [36];
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  _Optional_payload_base<_khr_df_model_channels_e> local_44;
  _Optional_payload_base<_khr_df_model_channels_e> local_3c;
  ktx_uint32_t *local_28;
  undefined1 local_19;
  KTXTexture2 *local_10;
  
  local_19 = 0;
  local_10 = in_RSI;
  TranscodeSwizzleInfo::TranscodeSwizzleInfo((TranscodeSwizzleInfo *)0x2aed59);
  args_1 = KTXTexture2::operator->(local_10);
  local_28 = args_1->pDfd + 1;
  local_3c = (_Optional_payload_base<_khr_df_model_channels_e>)
             getChannelType(in_stack_fffffffffffffeb8,
                            (uint32_t)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
  this = (_Optional_payload_base<_khr_df_model_channels_e>)
         getChannelType(in_stack_fffffffffffffeb8,
                        (uint32_t)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
  local_44 = this;
  __s = KTXTexture2::operator->(local_10);
  if (__s->supercompressionScheme == KTX_SS_BASIS_LZ) {
    in_RDI->defaultNumComponents = 0;
    local_48 = 0;
    uVar1 = std::operator==(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    uVar8 = false;
    if ((bool)uVar1) {
      local_4c = 0xf;
      in_stack_fffffffffffffee5 =
           std::operator==(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      uVar8 = in_stack_fffffffffffffee5;
    }
    if ((__optional_eq_t<_khr_df_model_channels_e,__khr_df_model_channels_e>)uVar8 == false) {
      local_50 = 0;
      uVar2 = std::operator==(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      if ((bool)uVar2) {
        in_RDI->defaultNumComponents = 3;
        std::__cxx11::string::operator=((string *)&in_RDI->swizzle,"rgb1");
      }
      else {
        local_54 = 3;
        uVar3 = std::operator==(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        uVar7 = false;
        if ((bool)uVar3) {
          local_58 = 4;
          in_stack_fffffffffffffee1 =
               std::operator==(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
          uVar7 = in_stack_fffffffffffffee1;
        }
        if ((__optional_eq_t<_khr_df_model_channels_e,__khr_df_model_channels_e>)uVar7 == false) {
          local_5c = 3;
          uVar4 = std::operator==(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
          if ((bool)uVar4) {
            in_RDI->defaultNumComponents = 1;
            std::__cxx11::string::operator=((string *)&in_RDI->swizzle,"r001");
          }
          else {
            bVar5 = std::optional::operator_cast_to_bool
                              ((optional<_khr_df_model_channels_e> *)0x2aeffc);
            local_82 = 0;
            if (bVar5) {
              std::optional<_khr_df_model_channels_e>::operator*
                        ((optional<_khr_df_model_channels_e> *)0x2af017);
              toString_abi_cxx11_((khr_df_model_e)((ulong)args_1 >> 0x20),
                                  (khr_df_model_channels_e)args_1);
            }
            else {
              std::allocator<char>::allocator();
              local_82 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         (char *)__s,
                         (allocator<char> *)
                         CONCAT17(uVar1,CONCAT16(uVar8,CONCAT15(in_stack_fffffffffffffee5,
                                                                CONCAT14(uVar2,CONCAT13(uVar3,
                                                  CONCAT12(uVar7,CONCAT11(in_stack_fffffffffffffee1,
                                                                          uVar4))))))));
            }
            local_aa = std::optional::operator_cast_to_bool
                                 ((optional<_khr_df_model_channels_e> *)0x2af071);
            if (local_aa) {
              std::optional<_khr_df_model_channels_e>::operator*
                        ((optional<_khr_df_model_channels_e> *)0x2af08c);
              toString_abi_cxx11_((khr_df_model_e)((ulong)args_1 >> 0x20),
                                  (khr_df_model_channels_e)args_1);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         (char *)__s,
                         (allocator<char> *)
                         CONCAT17(uVar1,CONCAT16(uVar8,CONCAT15(in_stack_fffffffffffffee5,
                                                                CONCAT14(uVar2,CONCAT13(uVar3,
                                                  CONCAT12(uVar7,CONCAT11(in_stack_fffffffffffffee1,
                                                                          uVar4))))))));
            }
            local_aa = !local_aa;
            Reporter::fatal<char_const(&)[59],std::__cxx11::string,std::__cxx11::string>
                      (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                       (char (*) [59])in_stack_ffffffffffffff28,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffff1f,
                                CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)));
            std::__cxx11::string::~string(local_a8);
            if (local_aa) {
              std::allocator<char>::~allocator(&local_a9);
            }
            std::__cxx11::string::~string(local_80);
            if ((local_82 & 1) != 0) {
              std::allocator<char>::~allocator(&local_81);
            }
          }
        }
        else {
          in_RDI->defaultNumComponents = 2;
          std::__cxx11::string::operator=((string *)&in_RDI->swizzle,"ra01");
        }
      }
    }
    else {
      in_RDI->defaultNumComponents = 4;
      std::__cxx11::string::operator=((string *)&in_RDI->swizzle,"rgba");
    }
  }
  else if ((local_28[2] & 0xff) == 0xa6) {
    in_RDI->defaultNumComponents = 0;
    _Var6 = std::operator==(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    if (_Var6) {
      in_RDI->defaultNumComponents = 4;
      std::__cxx11::string::operator=((string *)&in_RDI->swizzle,"rgba");
    }
    else {
      _Var6 = std::operator==(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      if (_Var6) {
        in_RDI->defaultNumComponents = 3;
        std::__cxx11::string::operator=((string *)&in_RDI->swizzle,"rgb1");
      }
      else {
        _Var6 = std::operator==(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        if (_Var6) {
          in_RDI->defaultNumComponents = 2;
          std::__cxx11::string::operator=((string *)&in_RDI->swizzle,"ra01");
        }
        else {
          _Var6 = std::operator==(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
          if (_Var6) {
            in_RDI->defaultNumComponents = 2;
            std::__cxx11::string::operator=((string *)&in_RDI->swizzle,"rg01");
          }
          else {
            _Var6 = std::operator==(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
            if (_Var6) {
              in_RDI->defaultNumComponents = 1;
              std::__cxx11::string::operator=((string *)&in_RDI->swizzle,"r001");
            }
            else {
              bVar5 = std::optional::operator_cast_to_bool
                                ((optional<_khr_df_model_channels_e> *)0x2af3cb);
              bVar9 = 0;
              if (bVar5) {
                std::optional<_khr_df_model_channels_e>::operator*
                          ((optional<_khr_df_model_channels_e> *)0x2af3e3);
                toString_abi_cxx11_((khr_df_model_e)((ulong)args_1 >> 0x20),
                                    (khr_df_model_channels_e)args_1);
              }
              else {
                std::allocator<char>::allocator();
                bVar9 = 1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                           ,(char *)__s,
                           (allocator<char> *)
                           CONCAT17(in_stack_fffffffffffffee7,
                                    CONCAT16(in_stack_fffffffffffffee6,
                                             CONCAT15(in_stack_fffffffffffffee5,
                                                      CONCAT14(in_stack_fffffffffffffee4,
                                                               CONCAT13(in_stack_fffffffffffffee3,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffee2,
                                                  CONCAT11(in_stack_fffffffffffffee1,
                                                           in_stack_fffffffffffffee0))))))));
              }
              Reporter::fatal<char_const(&)[51],std::__cxx11::string>
                        (in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                         (char (*) [51])
                         CONCAT17(in_stack_ffffffffffffff1f,
                                  CONCAT16(bVar9,in_stack_ffffffffffffff18)),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1
                        );
              std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
              if ((bVar9 & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1f);
              }
            }
          }
        }
      }
    }
  }
  else {
    Reporter::fatal<char_const(&)[67]>
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
               (char (*) [67])
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)));
  }
  return in_RDI;
}

Assistant:

TranscodeSwizzleInfo determineTranscodeSwizzle(const KTXTexture2& texture, Reporter& report) {
    TranscodeSwizzleInfo result;

    const auto* bdfd = texture->pDfd + 1;
    const auto sample0 = getChannelType(texture, 0);
    const auto sample1 = getChannelType(texture, 1);

    if (texture->supercompressionScheme == KTX_SS_BASIS_LZ) {
        result.defaultNumComponents = 0;
        if (sample0 == KHR_DF_CHANNEL_ETC1S_RGB && sample1 == KHR_DF_CHANNEL_ETC1S_AAA) {
            result.defaultNumComponents = 4;
            result.swizzle = "rgba";
        } else if (sample0 == KHR_DF_CHANNEL_ETC1S_RGB) {
            result.defaultNumComponents = 3;
            result.swizzle = "rgb1";
        } else if (sample0 == KHR_DF_CHANNEL_ETC1S_RRR && sample1 == KHR_DF_CHANNEL_ETC1S_GGG) {
            result.defaultNumComponents = 2;
            result.swizzle = "ra01";
        } else if (sample0 == KHR_DF_CHANNEL_ETC1S_RRR) {
            result.defaultNumComponents = 1;
            result.swizzle = "r001";
        } else {
            report.fatal(rc::INVALID_FILE, "Unsupported channel types for Basis-LZ transcoding: {}, {}",
                    sample0 ? toString(KHR_DF_MODEL_ETC1S, *sample0) : "-",
                    sample1 ? toString(KHR_DF_MODEL_ETC1S, *sample1) : "-");
        }
    } else if (khr_df_model_e(KHR_DFDVAL(bdfd, MODEL)) == KHR_DF_MODEL_UASTC) {
        result.defaultNumComponents = 0;
        if (sample0 == KHR_DF_CHANNEL_UASTC_RGBA) {
            result.defaultNumComponents = 4;
            result.swizzle = "rgba";
        } else if (sample0 == KHR_DF_CHANNEL_UASTC_RGB) {
            result.defaultNumComponents = 3;
            result.swizzle = "rgb1";
        } else if (sample0 == KHR_DF_CHANNEL_UASTC_RRRG) {
            result.defaultNumComponents = 2;
            result.swizzle = "ra01";
        } else if (sample0 == KHR_DF_CHANNEL_UASTC_RG) {
            result.defaultNumComponents = 2;
            result.swizzle = "rg01";
        } else if (sample0 == KHR_DF_CHANNEL_UASTC_RRR) {
            result.defaultNumComponents = 1;
            result.swizzle = "r001";
        } else {
            report.fatal(rc::INVALID_FILE, "Unsupported channel type for UASTC transcoding: {}",
                    sample0 ? toString(KHR_DF_MODEL_UASTC, *sample0) : "-");
        }
    } else {
        report.fatal(rc::INVALID_FILE, "Requested transcoding but input file is neither BasisLZ, nor UASTC");
    }

    return result;
}